

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

BasicBlock * __thiscall Loop::GetAnyTailBlock(Loop *this)

{
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  Loop *currentLoop;
  BasicBlock *pBVar5;
  undefined4 *puVar6;
  Type *ppFVar7;
  Loop *pLVar8;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pBVar5 = GetHeadBlock(this);
  local_40 = (undefined1  [8])&pBVar5->predList;
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  pBVar5 = (BasicBlock *)0x0;
  while( true ) {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_0042044d;
      *puVar6 = 0;
    }
    pSVar1 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar1 == local_40) break;
    __iter.list = pSVar1;
    ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    pBVar2 = (*ppFVar7)->predBlock;
    if (pBVar2 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xe61,"(pred)","pred");
      if (!bVar4) goto LAB_0042044d;
      *puVar6 = 0;
    }
    pLVar8 = pBVar2->loop;
    bVar4 = pLVar8 != (Loop *)0x0;
    if (pLVar8 != this && bVar4) {
      do {
        pLVar8 = pLVar8->parent;
        bVar4 = pLVar8 != (Loop *)0x0;
        if (pLVar8 == this) break;
      } while (pLVar8 != (Loop *)0x0);
    }
    if (bVar4) {
      pBVar5 = pBVar2;
    }
  }
  if (pBVar5 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xe69,"(tail)","tail");
    if (!bVar4) {
LAB_0042044d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  return pBVar5;
}

Assistant:

BasicBlock *
Loop::GetAnyTailBlock() const
{
    BasicBlock * tail = nullptr;

    BasicBlock * loopHeader = this->GetHeadBlock();
    FOREACH_PREDECESSOR_BLOCK(pred, loopHeader)
    {
        if (this->IsDescendentOrSelf(pred->loop))
        {
            tail = pred;
        }
    } NEXT_PREDECESSOR_BLOCK;
    
    Assert(tail);
    return tail;
}